

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O3

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::gsufread(SOLReader2<mp::SOLHandler_Easy> *this,FILE *f)

{
  NLW2_SOLReadResultCode *rr;
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  byte *pbVar6;
  long lVar7;
  char *pcVar8;
  ulong __n;
  byte *pbVar9;
  byte bVar10;
  NLW2_SOLReadResultCode unaff_R13D;
  SuffixReader<int> sr;
  SufRead SR;
  char buf [512];
  allocator<char> local_429;
  char *local_428;
  undefined1 local_420 [16];
  NLW2_SOLReadResultCode local_410;
  undefined4 uStack_40c;
  _Alloc_hider local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  uint local_3e8;
  _Alloc_hider local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  size_type local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  SuffixInfo local_3a0;
  SuffixInfo local_358;
  SuffixInfo local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  SufRead local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined4 local_238;
  undefined3 uStack_234;
  byte local_231 [513];
  
  rr = &this->readresult_;
  do {
    pcVar4 = fgets((char *)&local_238,0x1ff,(FILE *)f);
    if (pcVar4 == (char *)0x0) {
      return NLW2_SOLRead_OK;
    }
    local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pbVar6 = local_231;
    if (CONCAT31(uStack_234,local_238._3_1_) != 0x20786966 || local_238 != 0x66667573) {
      local_420._0_8_ = (FILE *)&local_410;
      sVar5 = strlen((char *)&local_238);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,&local_238,(long)&local_238 + sVar5);
      serror(this,"Bad line in \'%s\': %s",this->stub_,local_420._0_8_);
      goto LAB_0011acd9;
    }
    do {
      pbVar9 = pbVar6;
      bVar10 = *pbVar9;
      pbVar6 = pbVar9 + 1;
    } while (bVar10 == 0x20);
    if ((byte)(bVar10 - 0x3a) < 0xf6) {
LAB_0011ac97:
      local_420._0_8_ = (FILE *)&local_410;
      sVar5 = strlen((char *)&local_238);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_420,&local_238,(long)&local_238 + sVar5);
      serror(this,"Bad line in \'%s\': %s",this->stub_,local_420._0_8_);
LAB_0011acd9:
      *rr = NLW2_SOLRead_Bad_Line;
      if ((FILE *)local_420._0_8_ != (FILE *)&local_410) {
        operator_delete((void *)local_420._0_8_,CONCAT44(uStack_40c,local_410) + 1);
      }
      unaff_R13D = NLW2_SOLRead_Bad_Line;
LAB_0011acfd:
      bVar2 = false;
    }
    else {
      local_2a8.h.kind = (int)(byte)(bVar10 - 0x30);
      bVar10 = *pbVar6;
      if ((byte)(bVar10 - 0x30) < 10) {
        do {
          pbVar6 = pbVar9;
          local_2a8.h.kind = ((uint)bVar10 + local_2a8.h.kind * 10) - 0x30;
          bVar10 = pbVar6[2];
          pbVar9 = pbVar6 + 1;
        } while ((byte)(bVar10 - 0x30) < 10);
        pbVar6 = pbVar6 + 2;
      }
      bVar10 = *pbVar6;
      if (bVar10 < 0xd) {
        if ((bVar10 != 0) && (bVar10 != 10)) goto LAB_0011ac97;
      }
      else if (bVar10 != 0x20) {
        if ((bVar10 != 0xd) || (pbVar9[2] != 10)) goto LAB_0011ac97;
        pbVar6 = pbVar9 + 2;
      }
      do {
        bVar10 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar10 == 0x20);
      if ((byte)(bVar10 - 0x3a) < 0xf6) goto LAB_0011ac97;
      local_2a8.h.n = (int)(byte)(bVar10 - 0x30);
      bVar10 = *pbVar6;
      while ((byte)(bVar10 - 0x30) < 10) {
        local_2a8.h.n = ((uint)bVar10 + local_2a8.h.n * 10) - 0x30;
        pbVar9 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
        bVar10 = *pbVar9;
      }
      bVar10 = *pbVar6;
      if (bVar10 < 0xd) {
        if ((bVar10 != 0) && (bVar10 != 10)) goto LAB_0011ac97;
      }
      else if (bVar10 != 0x20) {
        if ((bVar10 != 0xd) || (pbVar6[1] != 10)) goto LAB_0011ac97;
        pbVar6 = pbVar6 + 1;
      }
      do {
        bVar10 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar10 == 0x20);
      if ((byte)(bVar10 - 0x3a) < 0xf6) goto LAB_0011ac97;
      local_2a8.h.namelen = (int)(byte)(bVar10 - 0x30);
      bVar10 = *pbVar6;
      while ((byte)(bVar10 - 0x30) < 10) {
        local_2a8.h.namelen = ((uint)bVar10 + local_2a8.h.namelen * 10) - 0x30;
        pbVar9 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
        bVar10 = *pbVar9;
      }
      bVar10 = *pbVar6;
      if (bVar10 < 0xd) {
        if ((bVar10 != 0) && (bVar10 != 10)) goto LAB_0011ac97;
      }
      else if (bVar10 != 0x20) {
        if ((bVar10 != 0xd) || (pbVar6[1] != 10)) goto LAB_0011ac97;
        pbVar6 = pbVar6 + 1;
      }
      do {
        bVar10 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar10 == 0x20);
      if ((byte)(bVar10 - 0x3a) < 0xf6) goto LAB_0011ac97;
      local_2a8.h.tablen = (int)(byte)(bVar10 - 0x30);
      bVar10 = *pbVar6;
      while ((byte)(bVar10 - 0x30) < 10) {
        local_2a8.h.tablen = ((uint)bVar10 + local_2a8.h.tablen * 10) - 0x30;
        pbVar9 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
        bVar10 = *pbVar9;
      }
      bVar10 = *pbVar6;
      if (bVar10 < 0xd) {
        if ((bVar10 != 0) && (bVar10 != 10)) goto LAB_0011ac97;
      }
      else if (bVar10 != 0x20) {
        if ((bVar10 != 0xd) || (pbVar6[1] != 10)) goto LAB_0011ac97;
        pbVar6 = pbVar6 + 1;
      }
      do {
        bVar10 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar10 == 0x20);
      if ((byte)(bVar10 - 0x3a) < 0xf6) goto LAB_0011ac97;
      local_2a8.tablines = (int)(byte)(bVar10 - 0x30);
      bVar10 = *pbVar6;
      while ((byte)(bVar10 - 0x30) < 10) {
        local_2a8.tablines = ((uint)bVar10 + local_2a8.tablines * 10) - 0x30;
        pbVar9 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
        bVar10 = *pbVar9;
      }
      bVar10 = *pbVar6;
      if (bVar10 < 0xd) {
        if (bVar10 != 0) {
joined_r0x0011ad8e:
          if (bVar10 != 10) goto LAB_0011ac97;
        }
      }
      else if (bVar10 != 0x20) {
        if (bVar10 == 0xd) {
          bVar10 = pbVar6[1];
          goto joined_r0x0011ad8e;
        }
        goto LAB_0011ac97;
      }
      iVar3 = sufheadcheck(this,&local_2a8);
      if (iVar3 != 0) {
        local_420._0_8_ = (FILE *)&local_410;
        sVar5 = strlen((char *)&local_238);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_420,&local_238,(long)&local_238 + sVar5);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_420._0_8_);
        goto LAB_0011acd9;
      }
      pcVar4 = fgets((char *)&local_238,0x1ff,(FILE *)f);
      if (pcVar4 == (char *)0x0) {
LAB_0011afb5:
        local_420._0_8_ = (FILE *)&local_410;
        sVar5 = strlen((char *)&local_238);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_420,&local_238,(long)&local_238 + sVar5);
        serror(this,"Bad line in \'%s\': %s",this->stub_,local_420._0_8_);
        goto LAB_0011acd9;
      }
      lVar7 = (long)local_2a8.h.namelen;
      cVar1 = *(char *)((long)&local_238 + lVar7 + -1);
      if ((cVar1 != '\n') && ((cVar1 != '\r' || (*(char *)((long)&local_238 + lVar7) != '\n'))))
      goto LAB_0011afb5;
      local_248._M_local_buf[lVar7 + 0xf] = '\0';
      strcpy(local_2a8.name,(char *)&local_238);
      if ((long)local_2a8.h.tablen != 0) {
        local_428 = local_2a8.table + local_2a8.h.tablen;
        pcVar4 = local_2a8.table;
        if (1 < local_2a8.tablines) {
          iVar3 = 1;
          do {
            pcVar8 = fgets(pcVar4,(int)local_428 - (int)pcVar4,(FILE *)f);
            if (pcVar8 == (char *)0x0) {
              unaff_R13D = ReportEarlyEof(this);
              goto LAB_0011acfd;
            }
            sVar5 = strlen(pcVar4);
            pcVar4 = pcVar4 + sVar5;
            iVar3 = iVar3 + 1;
          } while (iVar3 < local_2a8.tablines);
        }
        pcVar8 = fgets((char *)&local_238,0x1ff,(FILE *)f);
        if (pcVar8 != (char *)0x0) {
          sVar5 = strlen((char *)&local_238);
          if (((sVar5 == 0) || (local_248._M_local_buf[sVar5 + 0xf] != '\n')) ||
             (__n = sVar5 - 1, (ulong)((long)local_428 - (long)pcVar4) <= __n)) {
            local_420._0_8_ = (FILE *)&local_410;
            sVar5 = strlen((char *)&local_238);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_420,&local_238,(long)&local_238 + sVar5);
            serror(this,"Bad line in \'%s\': %s",this->stub_,local_420._0_8_);
            goto LAB_0011acd9;
          }
          if ((__n != 0) &&
             ((local_248._M_local_buf[sVar5 + 0xe] != '\r' || (__n = sVar5 - 2, __n != 0)))) {
            *(undefined1 *)((long)&local_238 + __n) = 0;
            memcpy(pcVar4,&local_238,__n);
          }
          goto LAB_0011af35;
        }
        unaff_R13D = ReportEarlyEof(this);
        goto LAB_0011acfd;
      }
LAB_0011af35:
      iVar3 = local_2a8.h.kind;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,local_2a8.name,(allocator<char> *)local_420);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,local_2a8.table,&local_429);
      local_3b8 = local_250;
      local_3d8 = local_2c0;
      local_3a0.kind_ = iVar3;
      if (local_2c8 == &local_2b8) {
        local_2c8 = &local_3a0.name_.field_2;
        local_3a0.name_.field_2._8_8_ = local_2b8._8_8_;
      }
      local_3a0.name_.field_2._M_allocated_capacity._1_7_ = local_2b8._M_allocated_capacity._1_7_;
      local_3a0.name_.field_2._M_local_buf[0] = local_2b8._M_local_buf[0];
      local_3d0._M_allocated_capacity = local_3a0.name_.field_2._M_allocated_capacity;
      local_2c0 = 0;
      local_2b8._M_local_buf[0] = '\0';
      if (local_258 == &local_248) {
        local_258 = &local_3a0.table_.field_2;
        local_3a0.table_.field_2._8_8_ = local_248._8_8_;
      }
      local_3a0.table_.field_2._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
      local_3a0.table_.field_2._M_local_buf[0] = local_248._M_local_buf[0];
      local_3b0._M_allocated_capacity = local_3a0.table_.field_2._M_allocated_capacity;
      local_3a0.table_._M_dataplus._M_p = (pointer)&local_3a0.table_.field_2;
      local_3a0.name_._M_dataplus._M_p = (pointer)&local_3a0.name_.field_2;
      local_250 = 0;
      local_248._M_local_buf[0] = '\0';
      local_420._0_8_ = f;
      if ((local_2a8.h.kind & 4U) == 0) {
        local_358.kind_ = iVar3;
        if (local_2c8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0.name_._M_dataplus._M_p) {
          local_2c8 = &local_358.name_.field_2;
          local_358.name_.field_2._8_8_ = local_3a0.name_.field_2._8_8_;
        }
        local_3a0.name_._M_string_length = 0;
        local_3a0.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_2b8._M_allocated_capacity._1_7_ << 8;
        if (local_258 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0.table_._M_dataplus._M_p) {
          local_258 = &local_358.table_.field_2;
          local_358.table_.field_2._8_8_ = local_3a0.table_.field_2._8_8_;
        }
        local_3a0.table_._M_string_length = 0;
        local_3a0.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_420._8_4_ = this->binary;
        local_420._12_4_ = local_2a8.h.n;
        local_410 = NLW2_SOLRead_OK;
        local_408._M_p = (pointer)&local_3f8;
        local_400 = 0;
        local_3f8._M_local_buf[0] = '\0';
        local_3e8 = iVar3;
        local_3e0._M_p = (pointer)local_2c8;
        if (local_2c8 == &local_358.name_.field_2) {
          local_3d0._8_8_ = local_358.name_.field_2._8_8_;
          local_3e0._M_p = (pointer)&local_3d0;
        }
        local_358.name_._M_dataplus._M_p = (pointer)&local_358.name_.field_2;
        local_358.name_._M_string_length = 0;
        local_358.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_2b8._M_allocated_capacity._1_7_ << 8;
        local_3c0._M_p = (pointer)local_258;
        if (local_258 == &local_358.table_.field_2) {
          local_3b0._8_8_ = local_358.table_.field_2._8_8_;
          local_3c0._M_p = (pointer)&local_3b0;
        }
        local_358.table_._M_dataplus._M_p = (pointer)&local_358.table_.field_2;
        local_358.table_._M_string_length = 0;
        local_358.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_2c8 = &local_2b8;
        local_258 = &local_248;
        SuffixInfo::~SuffixInfo(&local_358);
        SOLHandler_Easy::OnSuffix<mp::SuffixReader<int>>(this->solh_,(SuffixReader<int> *)local_420)
        ;
        bVar2 = CheckReader<mp::SuffixReader<int>>(this,(SuffixReader<int> *)local_420,rr);
        local_428 = (char *)CONCAT44(local_428._4_4_,*rr);
        SuffixReader<int>::~SuffixReader((SuffixReader<int> *)local_420);
      }
      else {
        local_310.kind_ = iVar3;
        if (local_2c8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0.name_._M_dataplus._M_p) {
          local_2c8 = &local_310.name_.field_2;
          local_310.name_.field_2._8_8_ = local_3a0.name_.field_2._8_8_;
        }
        local_3a0.name_._M_string_length = 0;
        local_3a0.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_2b8._M_allocated_capacity._1_7_ << 8;
        if (local_258 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0.table_._M_dataplus._M_p) {
          local_258 = &local_310.table_.field_2;
          local_310.table_.field_2._8_8_ = local_3a0.table_.field_2._8_8_;
        }
        local_3a0.table_._M_string_length = 0;
        local_3a0.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_420._8_4_ = this->binary;
        local_420._12_4_ = local_2a8.h.n;
        local_410 = NLW2_SOLRead_OK;
        local_408._M_p = (pointer)&local_3f8;
        local_400 = 0;
        local_3f8._M_local_buf[0] = '\0';
        local_3e8 = iVar3;
        local_3e0._M_p = (pointer)local_2c8;
        if (local_2c8 == &local_310.name_.field_2) {
          local_3d0._8_8_ = local_310.name_.field_2._8_8_;
          local_3e0._M_p = (pointer)&local_3d0;
        }
        local_310.name_._M_dataplus._M_p = (pointer)&local_310.name_.field_2;
        local_310.name_._M_string_length = 0;
        local_310.name_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_2b8._M_allocated_capacity._1_7_ << 8;
        local_3c0._M_p = (pointer)local_258;
        if (local_258 == &local_310.table_.field_2) {
          local_3b0._8_8_ = local_310.table_.field_2._8_8_;
          local_3c0._M_p = (pointer)&local_3b0;
        }
        local_310.table_._M_dataplus._M_p = (pointer)&local_310.table_.field_2;
        local_310.table_._M_string_length = 0;
        local_310.table_.field_2._M_allocated_capacity =
             (ulong)(uint7)local_248._M_allocated_capacity._1_7_ << 8;
        local_2c8 = &local_2b8;
        local_258 = &local_248;
        SuffixInfo::~SuffixInfo(&local_310);
        SOLHandler_Easy::OnSuffix<mp::SuffixReader<double>>
                  (this->solh_,(SuffixReader<double> *)local_420);
        bVar2 = CheckReader<mp::SuffixReader<double>>(this,(SuffixReader<double> *)local_420,rr);
        local_428 = (char *)CONCAT44(local_428._4_4_,*rr);
        SuffixReader<double>::~SuffixReader((SuffixReader<double> *)local_420);
      }
      if (bVar2 == false) {
        unaff_R13D = (NLW2_SOLReadResultCode)local_428;
      }
      bVar2 = bVar2 != false;
      SuffixInfo::~SuffixInfo(&local_3a0);
    }
    if (local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (!bVar2) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

NLW2_SOLReadResultCode SOLReader2<SOLHandler>::gsufread(FILE* f) {
  char *s, *se;
  size_t L;
  char buf[512];

  while(fgets(buf, sizeof(buf)-1, f)) {
    SufRead SR;
    if (strncmp(buf, "suffix ", 7))
      return ReportBadLine(buf);
    s = buf + 7;
    if (Lget(&s, &SR.h.kind)
        || Lget(&s, &SR.h.n)
        || Lget(&s, &SR.h.namelen)
        || Lget(&s, &SR.h.tablen)
        || Lget(&s, &SR.tablines))
      return ReportBadLine(buf);
    if (sufheadcheck(&SR))
      return ReportBadLine(buf);
    if (!fgets(buf, sizeof(buf)-1, f)
        || (buf[SR.h.namelen-1] != '\n'
            && (buf[SR.h.namelen-1] != '\r'
                || buf[SR.h.namelen] != '\n')))
      return ReportBadLine(buf);
    buf[SR.h.namelen-1] = 0;
    strcpy(SR.name, buf);
    if (SR.h.tablen) {
      s = SR.table;
      se = s + SR.h.tablen;
      for(int i = 1; i < SR.tablines; i++) {
        if (!fgets(s, se-s, f))
          return ReportEarlyEof();
        s += strlen(s);
      }
      if (!fgets(buf, sizeof(buf)-1, f))
        return ReportEarlyEof();
      if (!(L = strlen(buf)) || buf[--L] != '\n'
          || L >= (size_t)(se - s))
        return ReportBadLine(buf);
      if (L) {
        if (buf[L-1] != '\r' || --L) {
          buf[L] = 0;
          memcpy(s, buf, L);
        }
      }
    }
    SuffixInfo si(SR.h.kind, SR.name, SR.table);
    if (SR.h.kind & 4) {        // real-valued
      SuffixReader<double> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnDblSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    } else {                    // int-valued
      SuffixReader<int> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnIntSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    }
    //		sufput(&SR, ac, newsufs);
  }
  return NLW2_SOLRead_OK;
}